

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O0

string * __thiscall
pbrt::ParameterDictionary::ToParameterList_abi_cxx11_(ParameterDictionary *this,int indentCount)

{
  undefined4 in_EDX;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_RSI;
  string *in_RDI;
  ParsedParameter *p;
  const_iterator __end1;
  const_iterator __begin1;
  ParsedParameterVector *__range1;
  string *s;
  int in_stack_00000134;
  ParsedParameter *in_stack_00000138;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_stack_ffffffffffffff70;
  string local_68 [32];
  ParsedParameter *local_48;
  const_iterator local_40;
  const_iterator local_28;
  undefined1 local_15;
  undefined4 local_14;
  
  local_15 = 0;
  local_14 = in_EDX;
  std::__cxx11::string::string((string *)in_RDI);
  local_28 = InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
             ::begin(in_RSI);
  local_40 = InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
             ::end(in_stack_ffffffffffffff70);
  for (; local_28 != local_40; local_28 = local_28 + 1) {
    local_48 = *local_28;
    std::__cxx11::string::append((ulong)in_RDI,(char)local_14 + '\x04');
    ToParameterDefinition_abi_cxx11_(in_stack_00000138,in_stack_00000134);
    std::__cxx11::string::operator+=((string *)in_RDI,local_68);
    std::__cxx11::string::~string(local_68);
    std::__cxx11::string::operator+=((string *)in_RDI,"\n");
  }
  return in_RDI;
}

Assistant:

std::string ParameterDictionary::ToParameterList(int indentCount) const {
    std::string s;
    for (const ParsedParameter *p : params) {
        s.append(indentCount + 4, ' ');
        s += ToParameterDefinition(p, indentCount);
        s += "\n";
    }

    return s;
}